

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tcmp<int>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  int_t value;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  value = 1;
  if (iVar2 <= iVar1) {
    value = -(uint)(iVar2 < iVar1);
  }
  PUSH<int>(this,value);
  return;
}

Assistant:

void VM::Tcmp() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    if constexpr (std::is_floating_point_v<T>) {
        if (std::isnan(lhs) || std::isnan(rhs)) {
            PUSH(0);
            return;
        }
        else if (std::isinf(lhs) && std::isinf(rhs) && lhs * rhs > 0) {
            PUSH(0);
            return;
        }
    }
    if (lhs > rhs) {
        PUSH(1);
    }
    else if (lhs < rhs) {
        PUSH(-1);
    }
    else {
        PUSH(0);
    }
}